

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_stats_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  ulong uVar2;
  long *plVar3;
  __m128i *palVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  parasail_matrix_t *ppVar8;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar17;
  long lVar18;
  bool bVar19;
  int iVar20;
  int iVar21;
  parasail_result_t *ppVar22;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int64_t *ptr_06;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  size_t len;
  __m128i *palVar30;
  int iVar31;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  bool bVar37;
  ulong uVar38;
  longlong *plVar39;
  long lVar40;
  ulong uVar41;
  longlong lVar42;
  ulong size;
  long lVar43;
  size_t len_00;
  ulong uVar44;
  longlong lVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  longlong lVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  longlong lVar69;
  __m128i_64_t B_3;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  long lVar74;
  __m128i_64_t B;
  long lVar77;
  undefined1 auVar75 [16];
  long lVar78;
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  int64_t iVar82;
  __m128i_64_t B_7;
  undefined1 auVar84 [16];
  long lVar83;
  long lVar86;
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  __m128i_64_t A;
  undefined1 auVar92 [16];
  __m128i_64_t B_1;
  undefined1 auVar93 [16];
  __m128i_64_t B_8;
  undefined1 auVar94 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  __m128i_64_t B_9;
  undefined1 auVar102 [16];
  __m128i_64_t B_5;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i_64_t h;
  int local_2dc;
  ulong local_2c8;
  undefined1 local_298 [16];
  undefined1 local_278 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  ulong uStack_220;
  long local_1c8;
  int local_1c0;
  long local_1a8;
  long lStack_1a0;
  undefined1 local_198 [16];
  long local_158;
  long lStack_150;
  longlong local_c8;
  longlong lStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ulong local_a8;
  long lStack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  ulong uVar29;
  
  local_238._0_4_ = s1_beg;
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_stats_table_scan_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar7 = (profile->profile64).score;
    if (pvVar7 == (void *)0x0) {
      parasail_sg_flags_stats_table_scan_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar8 = profile->matrix;
      if (ppVar8 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_stats_table_scan_profile_sse41_128_64_cold_6();
      }
      else {
        uVar5 = profile->s1Len;
        if ((int)uVar5 < 1) {
          parasail_sg_flags_stats_table_scan_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_stats_table_scan_profile_sse41_128_64_cold_4();
        }
        else {
          uVar38 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_stats_table_scan_profile_sse41_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_stats_table_scan_profile_sse41_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_stats_table_scan_profile_sse41_128_64_cold_1();
          }
          else {
            uVar33 = uVar5 - 1;
            uVar41 = (ulong)uVar5 + 1;
            size = uVar41 >> 1;
            uVar11 = (ulong)uVar33 % size;
            iVar28 = (int)(uVar33 / size);
            pvVar9 = (profile->profile64).matches;
            pvVar10 = (profile->profile64).similar;
            uVar25 = -open;
            uVar29 = CONCAT44(0,uVar25);
            uVar6 = ppVar8->min;
            local_248._8_8_ = local_248._0_8_;
            local_248._0_8_ = uVar29;
            len_00 = 0x8000000000000000 - (long)(int)uVar6;
            if (uVar6 != uVar25 && SBORROW4(uVar6,uVar25) == (int)(uVar6 + open) < 0) {
              len_00 = (ulong)(uint)open | 0x8000000000000000;
            }
            iVar27 = ppVar8->max;
            ppVar22 = parasail_result_new_table3((uint)uVar41 & 0x7ffffffe,s2Len);
            if (ppVar22 != (parasail_result_t *)0x0) {
              ppVar22->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar22->flag | 0x2830402;
              b = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              b_01 = parasail_memalign___m128i(0x10,size);
              b_02 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              b_03 = parasail_memalign___m128i(0x10,size);
              b_04 = parasail_memalign___m128i(0x10,size);
              b_05 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              ptr_04 = parasail_memalign___m128i(0x10,size);
              ptr_05 = parasail_memalign___m128i(0x10,size);
              ptr_06 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1U));
              auVar46._0_8_ = -(ulong)(b == (__m128i *)0x0);
              auVar46._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
              auVar97._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
              auVar97._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
              auVar46 = packssdw(auVar46,auVar97);
              auVar64._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
              auVar64._8_8_ = -(ulong)(b_03 == (__m128i *)0x0);
              auVar100._0_8_ = -(ulong)(b_04 == (__m128i *)0x0);
              auVar100._8_8_ = -(ulong)(b_05 == (__m128i *)0x0);
              auVar64 = packssdw(auVar64,auVar100);
              auVar46 = packssdw(auVar46,auVar64);
              if (((((ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0) &&
                    ptr_05 != (__m128i *)0x0) &&
                   ((ptr_01 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) &&
                   ptr_02 != (__m128i *)0x0)) && ptr_06 != (int64_t *)0x0) &&
                  ((((((((((((((((auVar46 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                (auVar46 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar46 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar46 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar46 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar46 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar46 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar46 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar46 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar46 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar46 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar46 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar46 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar46 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar46 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar46[0xf])) {
                iVar20 = s2Len + -1;
                iVar21 = 1 - iVar28;
                uVar44 = (ulong)(uint)gap;
                uVar1 = len_00 + 1;
                local_b8 = 0x7ffffffffffffffe - (long)iVar27;
                lStack_a0 = 0;
                auVar47._8_4_ = (int)uVar1;
                auVar47._0_8_ = uVar1;
                auVar47._12_4_ = (int)(uVar1 >> 0x20);
                uStack_b0 = 0;
                auVar90._8_4_ = (int)local_b8;
                auVar90._0_8_ = local_b8;
                auVar90._12_4_ = (int)((ulong)local_b8 >> 0x20);
                auVar48._0_8_ = (long)iVar21;
                auVar48._8_4_ = iVar21;
                auVar48._12_4_ = iVar21 >> 0x1f;
                c[1] = uVar1;
                c[0] = size;
                len = len_00;
                local_a8 = uVar1;
                parasail_memset___m128i(b_03,c,len_00);
                c_00[1] = extraout_RDX;
                c_00[0] = size;
                parasail_memset___m128i(b_04,c_00,len);
                c_01[1] = extraout_RDX_00;
                c_01[0] = size;
                parasail_memset___m128i(b_05,c_01,len);
                c_02[1] = extraout_RDX_01;
                c_02[0] = size;
                parasail_memset___m128i(b,c_02,len);
                c_03[1] = extraout_RDX_02;
                c_03[0] = size;
                parasail_memset___m128i(b_00,c_03,len);
                c_04[1] = extraout_RDX_03;
                c_04[0] = size;
                parasail_memset___m128i(b_01,c_04,len);
                c_05[1] = extraout_RDX_04;
                c_05[0] = size;
                parasail_memset___m128i(b_02,c_05,len);
                uStack_220 = (ulong)(uint)gap;
                lVar74 = -(ulong)(uint)open;
                lVar77 = -(ulong)(uint)open;
                uVar6 = (uint)size;
                uVar23 = (ulong)(uVar6 - 1);
                lVar24 = uVar23 << 4;
                auVar49 = pmovsxbq(extraout_XMM0,0x101);
                auVar88._8_4_ = 0xffffffff;
                auVar88._0_8_ = 0xffffffffffffffff;
                auVar88._12_4_ = 0xffffffff;
                uVar34 = size;
                do {
                  plVar3 = (long *)((long)*ptr_04 + lVar24);
                  *plVar3 = lVar74;
                  plVar3[1] = lVar77;
                  *(undefined1 (*) [16])((long)*ptr_05 + lVar24) = auVar49;
                  lVar74 = lVar74 - uVar44;
                  lVar77 = lVar77 - uStack_220;
                  lVar86 = auVar49._8_8_;
                  auVar49._0_8_ = auVar49._0_8_ + 1;
                  auVar49._8_8_ = lVar86 - auVar88._8_8_;
                  lVar24 = lVar24 + -0x10;
                  iVar27 = (int)uVar34;
                  uVar26 = iVar27 - 1;
                  uVar34 = (ulong)uVar26;
                } while (uVar26 != 0 && 0 < iVar27);
                uVar34 = 0;
                do {
                  lVar74 = 0;
                  plVar39 = &local_c8;
                  bVar19 = true;
                  do {
                    bVar37 = bVar19;
                    if (s1_beg == 0) {
                      lVar42 = (long)(int)uVar25 - (lVar74 * size + uVar34) * (ulong)(uint)gap;
                    }
                    else {
                      lVar42 = 0;
                    }
                    *plVar39 = lVar42;
                    lVar74 = 1;
                    plVar39 = &lStack_c0;
                    bVar19 = false;
                  } while (bVar37);
                  ptr[uVar34][0] = local_c8;
                  ptr[uVar34][1] = lStack_c0;
                  uVar34 = uVar34 + 1;
                } while (uVar34 != size);
                *ptr_06 = 0;
                auVar46 = _DAT_00906ca0;
                lVar74 = uVar38 - 1;
                auVar50._8_4_ = (int)lVar74;
                auVar50._0_8_ = lVar74;
                auVar50._12_4_ = (int)((ulong)lVar74 >> 0x20);
                auVar64 = pmovsxbq(auVar88,0x100);
                auVar50 = auVar50 ^ _DAT_00906ca0;
                uVar34 = 0;
                do {
                  iVar27 = (int)uVar29;
                  if ((bool)(~(auVar50._0_8_ < (long)(uVar34 ^ auVar46._0_8_)) & 1)) {
                    iVar21 = 0;
                    if (s2_beg == 0) {
                      iVar21 = iVar27;
                    }
                    ptr_06[uVar34 + 1] = (long)iVar21;
                  }
                  auVar103._8_4_ = (int)uVar34;
                  auVar103._0_8_ = uVar34;
                  auVar103._12_4_ = (int)(uVar34 >> 0x20);
                  if ((long)((auVar103._8_8_ | auVar64._8_8_) ^ auVar46._8_8_) <= auVar50._8_8_) {
                    iVar21 = iVar27 - gap;
                    if (s2_beg != 0) {
                      iVar21 = 0;
                    }
                    ptr_06[uVar34 + 2] = (long)iVar21;
                  }
                  uVar34 = uVar34 + 2;
                  uVar29 = (ulong)(uint)(iVar27 + gap * -2);
                } while ((s2Len + 1U & 0xfffffffe) != uVar34);
                palVar4 = ptr + uVar23;
                palVar30 = ptr + uVar11;
                lVar74 = size * uVar38 * 4;
                local_1c8 = 0;
                local_198._8_8_ = auVar48._8_8_;
                local_198._8_8_ = -(ulong)(local_198._8_8_ == 0);
                local_198._0_8_ = -(ulong)(auVar48._0_8_ == 1);
                uVar29 = 0;
                auVar67 = auVar47;
                auVar76 = auVar47;
                auVar81 = auVar47;
                auVar85 = auVar47;
                auVar46 = auVar47;
                local_2dc = iVar20;
                do {
                  local_58 = auVar46;
                  local_88 = auVar85;
                  local_78 = auVar81;
                  local_68 = auVar76;
                  local_98 = auVar67;
                  lStack_1a0 = b_03[uVar23][0];
                  lStack_150 = b_04[uVar23][0];
                  local_48._8_8_ = b_05[uVar23][0];
                  auVar84._8_4_ = (int)(*palVar4)[0];
                  auVar84._0_8_ = (*palVar4)[0];
                  auVar84._12_4_ = *(undefined4 *)((long)*palVar4 + 4);
                  local_1a8 = 0;
                  local_158 = 0;
                  local_48._0_8_ = 0;
                  lVar35 = (long)ppVar8->mapper[(byte)s2[uVar29]] * (long)(int)uVar6 * 0x10;
                  lVar77 = uVar1 - (*ptr_04)[0];
                  lVar24 = auVar47._8_8_ - (*ptr_04)[1];
                  auVar64 = (undefined1  [16])0x0;
                  lVar43 = 0;
                  local_298 = (undefined1  [16])0x0;
                  local_278 = (undefined1  [16])0x0;
                  auVar46 = auVar47;
                  iVar82 = ptr_06[uVar29];
                  lVar86 = auVar84._8_8_;
                  do {
                    plVar3 = (long *)((long)*ptr + lVar43);
                    lVar17 = *plVar3;
                    lVar18 = plVar3[1];
                    auVar97 = *(undefined1 (*) [16])((long)*b_03 + lVar43);
                    auVar100 = *(undefined1 (*) [16])((long)*b_04 + lVar43);
                    plVar3 = (long *)((long)*b + lVar43);
                    auVar102._0_8_ = lVar17 - (ulong)(uint)open;
                    auVar102._8_8_ = lVar18 - (ulong)(uint)open;
                    uStack_220 = (ulong)(uint)gap;
                    auVar75._0_8_ = *plVar3 - uVar44;
                    auVar75._8_8_ = plVar3[1] - uStack_220;
                    auVar70._0_8_ = -(ulong)(auVar75._0_8_ < auVar102._0_8_);
                    auVar70._8_8_ = -(ulong)(auVar75._8_8_ < auVar102._8_8_);
                    auVar50 = blendvpd(*(undefined1 (*) [16])((long)*b_00 + lVar43),auVar97,auVar70)
                    ;
                    auVar103 = blendvpd(*(undefined1 (*) [16])((long)*b_01 + lVar43),auVar100,
                                        auVar70);
                    auVar48 = *(undefined1 (*) [16])((long)*b_05 + lVar43);
                    auVar88 = blendvpd(*(undefined1 (*) [16])((long)*b_02 + lVar43),auVar48,auVar70)
                    ;
                    plVar3 = (long *)((long)*ptr_04 + lVar43);
                    auVar93._0_8_ = lVar77 + *plVar3;
                    auVar93._8_8_ = lVar24 + plVar3[1];
                    auVar51._0_8_ = -(ulong)(auVar46._0_8_ < auVar93._0_8_);
                    auVar51._8_8_ = -(ulong)(auVar46._8_8_ < auVar93._8_8_);
                    auVar46 = blendvpd(auVar46,auVar93,auVar51);
                    local_278 = blendvpd(local_278,local_248,auVar51);
                    local_298 = blendvpd(local_298,local_238,auVar51);
                    plVar3 = (long *)((long)*ptr_05 + lVar43);
                    auVar95._0_8_ = in_XMM11._0_8_ + *plVar3;
                    auVar95._8_8_ = in_XMM11._8_8_ + plVar3[1];
                    auVar64 = blendvpd(auVar64,auVar95,auVar51);
                    plVar3 = (long *)((long)pvVar7 + lVar43 + lVar35);
                    lVar83 = iVar82 + *plVar3;
                    lVar86 = lVar86 + plVar3[1];
                    auVar49 = blendvpd(auVar75,auVar102,auVar70);
                    lVar40 = auVar49._0_8_;
                    lVar77 = lVar83;
                    if (lVar83 < lVar40) {
                      lVar77 = lVar40;
                    }
                    lVar78 = auVar49._8_8_;
                    lVar24 = lVar86;
                    if (lVar86 < lVar78) {
                      lVar24 = lVar78;
                    }
                    plVar3 = (long *)((long)pvVar9 + lVar43 + lVar35);
                    auVar94._0_8_ = local_1a8 + *plVar3;
                    auVar94._8_8_ = lStack_1a0 + plVar3[1];
                    plVar3 = (long *)((long)pvVar10 + lVar43 + lVar35);
                    auVar99._0_8_ = local_158 + *plVar3;
                    auVar99._8_8_ = lStack_150 + plVar3[1];
                    *(undefined1 (*) [16])((long)*b + lVar43) = auVar49;
                    auVar52._0_8_ = -(ulong)(lVar83 < lVar40);
                    auVar52._8_8_ = -(ulong)(lVar86 < lVar78);
                    local_248 = blendvpd(auVar94,auVar50,auVar52);
                    local_238 = blendvpd(auVar99,auVar103,auVar52);
                    auVar71._8_4_ = 0xffffffff;
                    auVar71._0_8_ = 0xffffffffffffffff;
                    auVar71._12_4_ = 0xffffffff;
                    auVar89._0_8_ = auVar88._0_8_ + 1;
                    auVar89._8_8_ = auVar88._8_8_ - auVar71._8_8_;
                    auVar96._0_8_ = local_48._0_8_ + 1;
                    auVar96._8_8_ = local_48._8_8_ - auVar71._8_8_;
                    in_XMM11 = blendvpd(auVar96,auVar89,auVar52);
                    *(undefined1 (*) [16])((long)*b_00 + lVar43) = auVar50;
                    *(undefined1 (*) [16])((long)*b_01 + lVar43) = auVar103;
                    *(undefined1 (*) [16])((long)*b_02 + lVar43) = auVar89;
                    plVar3 = (long *)((long)*ptr + lVar43);
                    *plVar3 = lVar83;
                    plVar3[1] = lVar86;
                    *(undefined1 (*) [16])((long)*b_03 + lVar43) = auVar94;
                    *(undefined1 (*) [16])((long)*b_04 + lVar43) = auVar99;
                    *(undefined1 (*) [16])((long)*b_05 + lVar43) = auVar96;
                    lVar43 = lVar43 + 0x10;
                    local_48._0_8_ = auVar48._0_8_;
                    local_48._8_8_ = auVar48._8_8_;
                    local_158 = auVar100._0_8_;
                    lStack_150 = auVar100._8_8_;
                    local_1a8 = auVar97._0_8_;
                    lStack_1a0 = auVar97._8_8_;
                    iVar82 = lVar17;
                    lVar86 = lVar18;
                  } while (size << 4 != lVar43);
                  uVar34 = ptr_06[uVar29 + 1];
                  auVar12._8_8_ = 0;
                  auVar12._0_8_ = local_248._0_8_;
                  local_248 = auVar12 << 0x40;
                  auVar13._8_8_ = 0;
                  auVar13._0_8_ = local_238._0_8_;
                  local_238 = auVar13 << 0x40;
                  auVar14._8_8_ = 0;
                  auVar14._0_8_ = in_XMM11._0_8_;
                  in_XMM11 = auVar14 << 0x40;
                  lVar24 = (*ptr_04)[0] + uVar34;
                  lVar86 = auVar46._0_8_;
                  auVar65._0_8_ = -(ulong)(lVar24 < lVar86);
                  auVar65._8_8_ = -(ulong)((*ptr_04)[1] + lVar77 < auVar46._8_8_);
                  if (lVar24 < lVar86) {
                    lVar24 = lVar86;
                  }
                  auVar97 = blendvpd(local_248,local_278,auVar65);
                  auVar100 = blendvpd(local_238,local_298,auVar65);
                  auVar46 = blendvpd((undefined1  [16])*ptr_05,auVar64,auVar65);
                  uVar2 = uVar29 + 1;
                  auVar98._8_8_ = 0;
                  auVar98._0_8_ = auVar97._0_8_;
                  auVar98 = auVar98 << 0x40;
                  auVar101._8_8_ = 0;
                  auVar101._0_8_ = auVar100._0_8_;
                  auVar101 = auVar101 << 0x40;
                  auVar15._8_8_ = 0;
                  auVar15._0_8_ = auVar46._0_8_;
                  auVar87 = auVar15 << 0x40;
                  auVar105._8_8_ = lVar24 + lStack_a0;
                  auVar105._0_8_ = local_a8;
                  uVar32 = uVar34;
                  if ((long)uVar34 < (long)local_a8) {
                    uVar32 = local_a8;
                  }
                  auVar53._0_8_ = -(ulong)((long)uVar34 < (long)local_a8);
                  auVar53._8_8_ = -(ulong)(lVar77 < auVar105._8_8_);
                  if (lVar77 < auVar105._8_8_) {
                    lVar77 = auVar105._8_8_;
                  }
                  auVar64 = blendvpd(local_248,auVar98,auVar53);
                  auVar97 = blendvpd(local_238,auVar101,auVar53);
                  auVar100 = blendvpd(in_XMM11,auVar87,auVar53);
                  auVar80._8_8_ = lVar77;
                  auVar80._0_8_ = uVar32;
                  lVar86 = 0;
                  lVar77 = lVar74;
                  lVar24 = local_1c8;
                  auVar46 = local_58;
                  do {
                    auVar79._0_8_ = auVar80._0_8_ - (ulong)(uint)open;
                    auVar79._8_8_ = auVar80._8_8_ - (ulong)(uint)open;
                    auVar104._0_8_ = auVar105._0_8_ - uVar44;
                    auVar104._8_8_ = auVar105._8_8_ - uStack_220;
                    auVar54._0_8_ = -(ulong)(auVar104._0_8_ < auVar79._0_8_);
                    auVar54._8_8_ = -(ulong)(auVar104._8_8_ < auVar79._8_8_);
                    auVar98 = blendvpd(auVar98,auVar64,auVar54);
                    auVar64 = *(undefined1 (*) [16])((long)*ptr + lVar86);
                    auVar101 = blendvpd(auVar101,auVar97,auVar54);
                    auVar97 = *(undefined1 (*) [16])((long)*b + lVar86);
                    auVar100 = blendvpd(auVar87,auVar100,auVar54);
                    auVar105 = blendvpd(auVar104,auVar79,auVar54);
                    auVar72._0_8_ = -(ulong)(auVar97._0_8_ < auVar64._0_8_);
                    auVar72._8_8_ = -(ulong)(auVar97._8_8_ < auVar64._8_8_);
                    auVar97 = blendvpd(auVar97,auVar64,auVar72);
                    auVar73._0_8_ = -(ulong)(auVar105._0_8_ < auVar97._0_8_);
                    auVar73._8_8_ = -(ulong)(auVar105._8_8_ < auVar97._8_8_);
                    auVar80 = blendvpd(auVar105,auVar97,auVar73);
                    auVar97 = blendvpd(auVar98,*(undefined1 (*) [16])((long)*b_00 + lVar86),auVar73)
                    ;
                    lVar35 = auVar80._0_8_;
                    auVar66._0_8_ = -(ulong)(auVar64._0_8_ == lVar35);
                    lVar43 = auVar80._8_8_;
                    auVar66._8_8_ = -(ulong)(auVar64._8_8_ == lVar43);
                    auVar64 = blendvpd(auVar97,*(undefined1 (*) [16])((long)*b_03 + lVar86),auVar66)
                    ;
                    auVar87._0_8_ = auVar100._0_8_ + 1;
                    auVar87._8_8_ = auVar100._8_8_ + 1;
                    auVar97 = blendvpd(auVar101,*(undefined1 (*) [16])((long)*b_01 + lVar86),auVar73
                                      );
                    auVar97 = blendvpd(auVar97,*(undefined1 (*) [16])((long)*b_04 + lVar86),auVar66)
                    ;
                    auVar100 = blendvpd(auVar87,*(undefined1 (*) [16])((long)*b_02 + lVar86),auVar73
                                       );
                    auVar100 = blendvpd(auVar100,*(undefined1 (*) [16])((long)*b_05 + lVar86),
                                        auVar66);
                    auVar55._0_8_ = -(ulong)(auVar90._0_8_ < lVar35);
                    auVar55._8_8_ = -(ulong)(auVar90._8_8_ < lVar43);
                    auVar90 = blendvpd(auVar80,auVar90,auVar55);
                    auVar56._0_8_ = -(ulong)(lVar35 < auVar46._0_8_);
                    auVar56._8_8_ = -(ulong)(lVar43 < auVar46._8_8_);
                    auVar46 = blendvpd(auVar80,auVar46,auVar56);
                    auVar57._0_8_ = -(ulong)(auVar64._0_8_ < auVar46._0_8_);
                    auVar57._8_8_ = -(ulong)(auVar64._8_8_ < auVar46._8_8_);
                    auVar46 = blendvpd(auVar64,auVar46,auVar57);
                    auVar58._0_8_ = -(ulong)(auVar97._0_8_ < auVar46._0_8_);
                    auVar58._8_8_ = -(ulong)(auVar97._8_8_ < auVar46._8_8_);
                    auVar46 = blendvpd(auVar97,auVar46,auVar58);
                    auVar59._0_8_ = -(ulong)(auVar100._0_8_ < auVar46._0_8_);
                    auVar59._8_8_ = -(ulong)(auVar100._8_8_ < auVar46._8_8_);
                    auVar46 = blendvpd(auVar100,auVar46,auVar59);
                    *(undefined1 (*) [16])((long)*ptr + lVar86) = auVar80;
                    *(undefined1 (*) [16])((long)*b_03 + lVar86) = auVar64;
                    *(undefined1 (*) [16])((long)*b_04 + lVar86) = auVar97;
                    *(undefined1 (*) [16])((long)*b_05 + lVar86) = auVar100;
                    lVar35 = *((ppVar22->field_4).trace)->trace_del_table;
                    *(int *)(lVar35 + lVar24) = auVar80._0_4_;
                    *(int *)(lVar35 + lVar77) = auVar80._8_4_;
                    lVar35 = *(long *)((long)((ppVar22->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar35 + lVar24) = auVar64._0_4_;
                    *(int *)(lVar35 + lVar77) = auVar64._8_4_;
                    lVar35 = *(long *)((long)((ppVar22->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar35 + lVar24) = auVar97._0_4_;
                    *(int *)(lVar35 + lVar77) = auVar97._8_4_;
                    lVar35 = *(long *)((long)((ppVar22->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar35 + lVar24) = auVar100._0_4_;
                    *(int *)(lVar35 + lVar77) = auVar100._8_4_;
                    lVar86 = lVar86 + 0x10;
                    lVar77 = lVar77 + uVar38 * 4;
                    lVar24 = lVar24 + uVar38 * 4;
                  } while (size << 4 != lVar86);
                  lVar77 = (*palVar30)[0];
                  if ((*palVar30)[0] < (long)local_98._0_8_) {
                    lVar77 = local_98._0_8_;
                  }
                  local_2c8 = (*palVar30)[1];
                  if ((*palVar30)[1] < (long)local_98._8_8_) {
                    local_2c8 = local_98._8_8_;
                  }
                  auVar60._0_8_ = -(ulong)((long)local_98._0_8_ < (*palVar30)[0]);
                  auVar60._8_8_ = -(ulong)((long)local_98._8_8_ < (*palVar30)[1]);
                  auVar85 = blendvpd(local_88,(undefined1  [16])b_03[uVar11],auVar60);
                  uVar34 = auVar85._8_8_;
                  auVar81 = blendvpd(local_78,(undefined1  [16])b_04[uVar11],auVar60);
                  uVar32 = auVar81._8_8_;
                  auVar76 = blendvpd(local_68,(undefined1  [16])b_05[uVar11],auVar60);
                  uVar36 = auVar76._8_8_;
                  auVar67._8_8_ = local_2c8;
                  auVar67._0_8_ = lVar77;
                  iVar27 = movmskpd((int)lVar77,auVar60 & local_198);
                  local_1c0 = (int)uVar29;
                  if (iVar27 != 0) {
                    local_2dc = local_1c0;
                  }
                  lVar74 = lVar74 + 4;
                  local_1c8 = local_1c8 + 4;
                  uVar29 = uVar2;
                } while (uVar2 != uVar38);
                if (s2_end == 0) {
                  uVar34 = 0;
                  uVar32 = 0;
                  uVar36 = 0;
                  local_2c8 = uVar1;
                }
                else if (iVar28 < 1) {
                  do {
                    local_2c8 = auVar67._0_8_;
                    auVar16._8_8_ = 0;
                    auVar16._0_8_ = local_2c8;
                    auVar67 = auVar16 << 0x40;
                    uVar34 = auVar85._0_8_;
                    auVar85._8_8_ = 0;
                    auVar85._0_8_ = uVar34;
                    auVar85 = auVar85 << 0x40;
                    uVar32 = auVar81._0_8_;
                    auVar81._8_8_ = 0;
                    auVar81._0_8_ = uVar32;
                    auVar81 = auVar81 << 0x40;
                    uVar36 = auVar76._0_8_;
                    auVar76._8_8_ = 0;
                    auVar76._0_8_ = uVar36;
                    auVar76 = auVar76 << 0x40;
                  } while (iVar28 < 0);
                }
                iVar21 = (int)uVar36;
                iVar31 = (int)uVar32;
                iVar27 = (int)uVar34;
                uVar25 = uVar33;
                if ((s1_end != 0) && ((uVar41 & 0x7ffffffe) != 0)) {
                  uVar38 = 0;
                  do {
                    uVar26 = 0;
                    if ((uVar38 & 1) != 0) {
                      uVar26 = uVar6;
                    }
                    uVar26 = uVar26 + ((uint)(uVar38 >> 1) & 0x7fffffff);
                    if ((int)uVar26 < (int)uVar5) {
                      uVar41 = (*ptr)[uVar38];
                      if (((long)local_2c8 < (long)uVar41) ||
                         (((uVar41 == local_2c8 && (local_2dc == iVar20)) &&
                          (uVar41 = local_2c8, (int)uVar26 < (int)uVar25)))) {
                        uVar34 = (*b_03)[uVar38];
                        uVar32 = (*b_04)[uVar38];
                        uVar36 = (*b_05)[uVar38];
                        uVar25 = uVar26;
                        local_2dc = iVar20;
                        local_2c8 = uVar41;
                      }
                    }
                    iVar21 = (int)uVar36;
                    iVar31 = (int)uVar32;
                    iVar27 = (int)uVar34;
                    uVar38 = uVar38 + 1;
                  } while ((uVar6 & 0x3fffffff) * 2 != (int)uVar38);
                }
                if (s2_end == 0 && s1_end == 0) {
                  lVar42 = ptr[uVar11][0];
                  local_2c8._0_4_ = (int)ptr[uVar11][1];
                  lVar69 = b_03[uVar11][0];
                  iVar27 = (int)b_03[uVar11][1];
                  lVar63 = b_04[uVar11][0];
                  iVar31 = (int)b_04[uVar11][1];
                  lVar45 = b_05[uVar11][0];
                  iVar21 = (int)b_05[uVar11][1];
                  uVar25 = uVar33;
                  s1_end = iVar20;
                  local_2dc = iVar20;
                  if (iVar28 < 1) {
                    do {
                      local_2c8._0_4_ = (int)lVar42;
                      iVar21 = (int)lVar45;
                      iVar31 = (int)lVar63;
                      iVar27 = (int)lVar69;
                      lVar42 = 0;
                      lVar69 = 0;
                      lVar63 = 0;
                      lVar45 = 0;
                    } while (iVar28 < 0);
                  }
                }
                auVar61._8_4_ = (int)len_00;
                auVar61._0_8_ = len_00;
                auVar61._12_4_ = (int)(len_00 >> 0x20);
                auVar91._0_8_ = -(ulong)((long)len_00 < auVar90._0_8_);
                auVar91._8_8_ = -(ulong)(auVar61._8_8_ < auVar90._8_8_);
                auVar62._8_4_ = 0xffffffff;
                auVar62._0_8_ = 0xffffffffffffffff;
                auVar62._12_4_ = 0xffffffff;
                auVar68._8_4_ = (undefined4)local_b8;
                auVar68._0_8_ = local_b8;
                auVar68._12_4_ = local_b8._4_4_;
                auVar92._0_8_ = -(ulong)(local_b8 < auVar46._0_8_);
                auVar92._8_8_ = -(ulong)(auVar68._8_8_ < auVar46._8_8_);
                iVar28 = movmskpd(s1_end,auVar92 | auVar62 ^ auVar91);
                if (iVar28 != 0) {
                  *(byte *)&ppVar22->flag = (byte)ppVar22->flag | 0x40;
                  local_2c8._0_4_ = 0;
                  iVar27 = 0;
                  iVar31 = 0;
                  iVar21 = 0;
                  local_2dc = 0;
                  uVar25 = 0;
                }
                ppVar22->score = (int)local_2c8;
                ppVar22->end_query = uVar25;
                ppVar22->end_ref = local_2dc;
                ((ppVar22->field_4).stats)->matches = iVar27;
                ((ppVar22->field_4).stats)->similar = iVar31;
                ((ppVar22->field_4).stats)->length = iVar21;
                local_48 = auVar48;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar22;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile64.score;
    pvPm = (__m128i*)profile->profile64.matches;
    pvPs = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            vGapperL = _mm_add_epi64(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHpM = _mm_slli_si128(vHpM, 8);
        vHpS = _mm_slli_si128(vHpS, 8);
        vHpL = _mm_slli_si128(vHpL, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi64(vH, vGapO);
            vE_ext = _mm_sub_epi64(vE, vGapE);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vGapper = _mm_add_epi64(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vF, vGapper),
                    _mm_cmpeq_epi64(vF, vGapper));
            vF = _mm_max_epi64_rpl(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi64(vHp, vW);
            vHpM = _mm_add_epi64(vHpM, vWM);
            vHpS = _mm_add_epi64(vHpS, vWS);
            vHpL = _mm_add_epi64(vHpL, vOne);
            case1 = _mm_cmpgt_epi64_rpl(vE, vHp);
            vHt = _mm_max_epi64_rpl(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHtM = _mm_slli_si128(vHtM, 8);
        vHtS = _mm_slli_si128(vHtS, 8);
        vHtL = _mm_slli_si128(vHtL, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi64(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi64_rpl(vGapper, vF),
                _mm_cmpeq_epi64(vGapper, vF));
        vF = _mm_max_epi64_rpl(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            __m128i vFtM = _mm_slli_si128(vFM, 8);
            __m128i vFtS = _mm_slli_si128(vFS, 8);
            __m128i vFtL = _mm_slli_si128(vFL, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vFt, vF),
                    _mm_cmpeq_epi64(vFt, vF));
            vF = _mm_max_epi64_rpl(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vFM = _mm_slli_si128(vFM, 8);
        vFS = _mm_slli_si128(vFS, 8);
        vFL = _mm_slli_si128(vFL, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi64_rpl(vF, vHt);
        vH = _mm_max_epi64_rpl(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi64(vH, vGapO);
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vH = _mm_max_epi64_rpl(vHp, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            case1 = _mm_cmpeq_epi64(vH, vHp);
            case2 = _mm_cmpeq_epi64(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            cond_max = _mm_cmpgt_epi64_rpl(vH, vMaxH);
            vMaxH = _mm_max_epi64_rpl(vMaxH, vH);
            vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
            vMaxM = _mm_slli_si128(vMaxM, 8);
            vMaxS = _mm_slli_si128(vMaxS, 8);
            vMaxL = _mm_slli_si128(vMaxL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl(vMaxM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl(vMaxS, 1);
        length = (int64_t) _mm_extract_epi64_rpl(vMaxL, 1);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int64_t *m = (int64_t*)pvHM;
        int64_t *s = (int64_t*)pvHS;
        int64_t *l = (int64_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
            vHM = _mm_slli_si128(vHM, 8);
            vHS = _mm_slli_si128(vHS, 8);
            vHL = _mm_slli_si128(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}